

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O0

int zddGroupSiftingAux(DdManager *table,int x,int xLow,int xHigh)

{
  uint size;
  DdNode *pDVar1;
  int iVar2;
  int result;
  int initialSize;
  Move *moves;
  Move *move;
  int local_20;
  int xHigh_local;
  int xLow_local;
  int x_local;
  DdManager *table_local;
  
  size = table->keysZ;
  _result = (DdNode *)0x0;
  move._4_4_ = xHigh;
  local_20 = xLow;
  xHigh_local = x;
  _xLow_local = table;
  if (x == xLow) {
    if (x == xHigh) {
      return 1;
    }
    iVar2 = zddGroupSiftingDown(table,x,xHigh,(Move **)&result);
    if (iVar2 == 0) goto LAB_00c23bf8;
    iVar2 = zddGroupSiftingBackward(_xLow_local,(Move *)_result,size);
  }
  else {
    iVar2 = cuddZddNextHigh(table,x);
    if (move._4_4_ < iVar2) {
      xHigh_local = _xLow_local->subtableZ[xHigh_local].next;
      iVar2 = zddGroupSiftingUp(_xLow_local,xHigh_local,local_20,(Move **)&result);
      if (iVar2 == 0) goto LAB_00c23bf8;
      iVar2 = zddGroupSiftingBackward(_xLow_local,(Move *)_result,size);
    }
    else if (move._4_4_ - xHigh_local < xHigh_local - local_20) {
      iVar2 = zddGroupSiftingDown(_xLow_local,xHigh_local,move._4_4_,(Move **)&result);
      if (iVar2 == 0) goto LAB_00c23bf8;
      if (_result != (DdNode *)0x0) {
        xHigh_local = _result->ref;
      }
      for (; (uint)xHigh_local < _xLow_local->subtableZ[xHigh_local].next;
          xHigh_local = _xLow_local->subtableZ[xHigh_local].next) {
      }
      xHigh_local = _xLow_local->subtableZ[xHigh_local].next;
      iVar2 = zddGroupSiftingUp(_xLow_local,xHigh_local,local_20,(Move **)&result);
      if (iVar2 == 0) goto LAB_00c23bf8;
      iVar2 = zddGroupSiftingBackward(_xLow_local,(Move *)_result,size);
    }
    else {
      xHigh_local = _xLow_local->subtableZ[xHigh_local].next;
      iVar2 = zddGroupSiftingUp(_xLow_local,xHigh_local,local_20,(Move **)&result);
      if (iVar2 == 0) goto LAB_00c23bf8;
      if (_result != (DdNode *)0x0) {
        xHigh_local = _result->index;
      }
      for (; (uint)xHigh_local < _xLow_local->subtableZ[xHigh_local].next;
          xHigh_local = _xLow_local->subtableZ[xHigh_local].next) {
      }
      iVar2 = zddGroupSiftingDown(_xLow_local,xHigh_local,move._4_4_,(Move **)&result);
      if (iVar2 == 0) goto LAB_00c23bf8;
      iVar2 = zddGroupSiftingBackward(_xLow_local,(Move *)_result,size);
    }
  }
  if (iVar2 != 0) {
    while (_result != (DdNode *)0x0) {
      pDVar1 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = _xLow_local->nextFree;
      _xLow_local->nextFree = _result;
      _result = pDVar1;
    }
    return 1;
  }
LAB_00c23bf8:
  while (_result != (DdNode *)0x0) {
    pDVar1 = (_result->type).kids.T;
    _result->ref = 0;
    _result->next = _xLow_local->nextFree;
    _xLow_local->nextFree = _result;
    _result = pDVar1;
  }
  return 0;
}

Assistant:

static int
zddGroupSiftingAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh)
{
    Move *move;
    Move *moves;        /* list of moves */
    int  initialSize;
    int  result;


#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingAux from %d to %d\n",xLow,xHigh);
    assert((unsigned) x >= table->subtableZ[x].next); /* x is bottom of group */
#endif

    initialSize = table->keysZ;
    moves = NULL;

    if (x == xLow) { /* Sift down */
#ifdef DD_DEBUG
        /* x must be a singleton */
        assert((unsigned) x == table->subtableZ[x].next);
#endif
        if (x == xHigh) return(1);      /* just one variable */

        if (!zddGroupSiftingDown(table,x,xHigh,&moves))
            goto zddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* move backward and stop at best position */
        result = zddGroupSiftingBackward(table,moves,initialSize);
#ifdef DD_DEBUG
        assert(table->keysZ <= (unsigned) initialSize);
#endif
        if (!result) goto zddGroupSiftingAuxOutOfMem;

    } else if (cuddZddNextHigh(table,x) > xHigh) { /* Sift up */
#ifdef DD_DEBUG
        /* x is bottom of group */
        assert((unsigned) x >= table->subtableZ[x].next);
#endif
        /* Find top of x's group */
        x = table->subtableZ[x].next;

        if (!zddGroupSiftingUp(table,x,xLow,&moves))
            goto zddGroupSiftingAuxOutOfMem;
        /* at this point x == xLow, unless early term */

        /* move backward and stop at best position */
        result = zddGroupSiftingBackward(table,moves,initialSize);
#ifdef DD_DEBUG
        assert(table->keysZ <= (unsigned) initialSize);
#endif
        if (!result) goto zddGroupSiftingAuxOutOfMem;

    } else if (x - xLow > xHigh - x) { /* must go down first: shorter */
        if (!zddGroupSiftingDown(table,x,xHigh,&moves))
            goto zddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* Find top of group */
        if (moves) {
            x = moves->y;
        }
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
        x = table->subtableZ[x].next;
#ifdef DD_DEBUG
        /* x should be the top of a group */
        assert((unsigned) x <= table->subtableZ[x].next);
#endif

        if (!zddGroupSiftingUp(table,x,xLow,&moves))
            goto zddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = zddGroupSiftingBackward(table,moves,initialSize);
#ifdef DD_DEBUG
        assert(table->keysZ <= (unsigned) initialSize);
#endif
        if (!result) goto zddGroupSiftingAuxOutOfMem;

    } else { /* moving up first: shorter */
        /* Find top of x's group */
        x = table->subtableZ[x].next;

        if (!zddGroupSiftingUp(table,x,xLow,&moves))
            goto zddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        if (moves) {
            x = moves->x;
        }
        while ((unsigned) x < table->subtableZ[x].next)
            x = table->subtableZ[x].next;
#ifdef DD_DEBUG
        /* x is bottom of a group */
        assert((unsigned) x >= table->subtableZ[x].next);
#endif

        if (!zddGroupSiftingDown(table,x,xHigh,&moves))
            goto zddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = zddGroupSiftingBackward(table,moves,initialSize);
#ifdef DD_DEBUG
        assert(table->keysZ <= (unsigned) initialSize);
#endif
        if (!result) goto zddGroupSiftingAuxOutOfMem;
    }

    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(1);

zddGroupSiftingAuxOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}